

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.h
# Opt level: O2

void __thiscall xemmai::t_thread::t_internal::f_epoch_resume(t_internal *this)

{
  pthread_t __threadid;
  system_error *this_00;
  error_category *__ecat;
  int iVar1;
  
  __threadid = this->v_handle;
  iVar1 = __libc_current_sigrtmax();
  iVar1 = pthread_kill(__threadid,iVar1);
  if (iVar1 == 0) {
    return;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x20);
  __ecat = (error_category *)std::_V2::generic_category();
  std::system_error::system_error(this_00,iVar1,__ecat);
  __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

inline void t_thread::t_internal::f_epoch_resume()
{
#ifdef __unix__
	if (auto error = pthread_kill(v_handle, XEMMAI__SIGNAL_RESUME)) throw std::system_error(error, std::generic_category());
#endif
#ifdef _WIN32
	if (!ResumeThread(v_handle)) throw std::system_error(GetLastError(), std::system_category());
#endif
}